

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metropolis.hpp
# Opt level: O3

void bcl::metropolis::
     generate_transition_matrix_resize<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
               (vector<double,_std::allocator<double>_> *weights,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *tm)

{
  pointer pdVar1;
  pointer pdVar2;
  long lVar3;
  long lVar4;
  size_type __new_size;
  
  pdVar1 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar2 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  __new_size = (long)pdVar1 - (long)pdVar2 >> 3;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(tm,__new_size);
  if (pdVar1 != pdVar2) {
    lVar3 = __new_size + (__new_size == 0);
    lVar4 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((tm->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar4),__new_size);
      lVar4 = lVar4 + 0x18;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  generate_transition_matrix<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
            (weights,tm);
  return;
}

Assistant:

static void generate_transition_matrix_resize(VEC const& weights, MAT& tm) {
    std::size_t n = weights.size();
    tm.resize(n);
    for (std::size_t i = 0; i < n; ++i) tm[i].resize(n);
    generate_transition_matrix(weights, tm);
  }